

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void quoteFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  int iVar1;
  void *pvVar2;
  undefined1 *puVar3;
  uchar *z_00;
  sqlite3_value *pValue;
  undefined8 *in_RDX;
  char *z;
  uchar *zArg;
  u64 n;
  int j;
  int i_1;
  int i;
  int nBlob;
  char *zBlob;
  char *zText;
  char zBuf [50];
  double r2;
  double r1;
  sqlite3_context *in_stack_ffffffffffffff60;
  int n_00;
  sqlite3_value *in_stack_ffffffffffffff68;
  sqlite3_context *in_stack_ffffffffffffff70;
  sqlite3_context *context_00;
  int local_88;
  int local_84;
  int local_80;
  char local_68 [64];
  double local_28;
  double local_20;
  
  iVar1 = sqlite3_value_type((sqlite3_value *)*in_RDX);
  pValue = (sqlite3_value *)(ulong)(iVar1 - 1);
  switch(pValue) {
  case (sqlite3_value *)0x0:
    sqlite3_result_value(in_stack_ffffffffffffff60,pValue);
    break;
  case (sqlite3_value *)0x1:
    local_20 = sqlite3_value_double((sqlite3_value *)0x1dc663);
    iVar1 = (int)((ulong)in_stack_ffffffffffffff60 >> 0x20);
    sqlite3_snprintf((int)local_20,(char *)0x32,local_68,"%!.15g");
    sqlite3AtoF(zText,(double *)CONCAT44(zBlob._4_4_,zBlob._0_4_),nBlob,i._3_1_);
    if ((local_20 != local_28) || (NAN(local_20) || NAN(local_28))) {
      sqlite3_snprintf((int)local_20,(char *)0x32,local_68,"%!.20e");
    }
    sqlite3_result_text(in_stack_ffffffffffffff70,(char *)in_stack_ffffffffffffff68,iVar1,
                        (_func_void_void_ptr *)pValue);
    break;
  case (sqlite3_value *)0x2:
    z_00 = sqlite3_value_text((sqlite3_value *)0x1dc87c);
    if (z_00 != (uchar *)0x0) {
      context_00 = (sqlite3_context *)0x0;
      for (local_84 = 0; z_00[local_84] != '\0'; local_84 = local_84 + 1) {
        if (z_00[local_84] == '\'') {
          context_00 = (sqlite3_context *)((long)&context_00->pOut + 1);
        }
      }
      puVar3 = (undefined1 *)contextMalloc(context_00,(i64)z_00);
      if (puVar3 != (undefined1 *)0x0) {
        *puVar3 = 0x27;
        local_88 = 1;
        for (local_84 = 0; z_00[local_84] != '\0'; local_84 = local_84 + 1) {
          puVar3[local_88] = z_00[local_84];
          iVar1 = local_88 + 1;
          if (z_00[local_84] == '\'') {
            puVar3[local_88 + 1] = 0x27;
            iVar1 = local_88 + 2;
          }
          local_88 = iVar1;
        }
        puVar3[local_88] = 0x27;
        puVar3[local_88 + 1] = 0;
        sqlite3_result_text(context_00,(char *)z_00,(int)((ulong)puVar3 >> 0x20),
                            (_func_void_void_ptr *)pValue);
      }
    }
    break;
  case (sqlite3_value *)0x3:
    pvVar2 = sqlite3_value_blob(in_stack_ffffffffffffff68);
    n_00 = (int)((ulong)in_stack_ffffffffffffff60 >> 0x20);
    iVar1 = sqlite3_value_bytes((sqlite3_value *)0x1dc750);
    puVar3 = (undefined1 *)contextMalloc(in_stack_ffffffffffffff70,(i64)in_stack_ffffffffffffff68);
    if (puVar3 != (undefined1 *)0x0) {
      for (local_80 = 0; local_80 < iVar1; local_80 = local_80 + 1) {
        puVar3[local_80 * 2 + 2] =
             "0123456789ABCDEF"[(int)(uint)*(byte *)((long)pvVar2 + (long)local_80) >> 4];
        puVar3[local_80 * 2 + 3] =
             "0123456789ABCDEF"[(int)(*(byte *)((long)pvVar2 + (long)local_80) & 0xf)];
      }
      puVar3[iVar1 * 2 + 2] = 0x27;
      puVar3[iVar1 * 2 + 3] = 0;
      *puVar3 = 0x58;
      puVar3[1] = 0x27;
      sqlite3_result_text(in_stack_ffffffffffffff70,(char *)in_stack_ffffffffffffff68,n_00,
                          (_func_void_void_ptr *)pValue);
      sqlite3_free((void *)0x1dc867);
    }
    break;
  default:
    sqlite3_result_text(in_stack_ffffffffffffff70,(char *)in_stack_ffffffffffffff68,
                        (int)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                        (_func_void_void_ptr *)pValue);
  }
  return;
}

Assistant:

static void quoteFunc(sqlite3_context *context, int argc, sqlite3_value **argv){
  assert( argc==1 );
  UNUSED_PARAMETER(argc);
  switch( sqlite3_value_type(argv[0]) ){
    case SQLITE_FLOAT: {
      double r1, r2;
      char zBuf[50];
      r1 = sqlite3_value_double(argv[0]);
      sqlite3_snprintf(sizeof(zBuf), zBuf, "%!.15g", r1);
      sqlite3AtoF(zBuf, &r2, 20, SQLITE_UTF8);
      if( r1!=r2 ){
        sqlite3_snprintf(sizeof(zBuf), zBuf, "%!.20e", r1);
      }
      sqlite3_result_text(context, zBuf, -1, SQLITE_TRANSIENT);
      break;
    }
    case SQLITE_INTEGER: {
      sqlite3_result_value(context, argv[0]);
      break;
    }
    case SQLITE_BLOB: {
      char *zText = 0;
      char const *zBlob = sqlite3_value_blob(argv[0]);
      int nBlob = sqlite3_value_bytes(argv[0]);
      assert( zBlob==sqlite3_value_blob(argv[0]) ); /* No encoding change */
      zText = (char *)contextMalloc(context, (2*(i64)nBlob)+4); 
      if( zText ){
        int i;
        for(i=0; i<nBlob; i++){
          zText[(i*2)+2] = hexdigits[(zBlob[i]>>4)&0x0F];
          zText[(i*2)+3] = hexdigits[(zBlob[i])&0x0F];
        }
        zText[(nBlob*2)+2] = '\'';
        zText[(nBlob*2)+3] = '\0';
        zText[0] = 'X';
        zText[1] = '\'';
        sqlite3_result_text(context, zText, -1, SQLITE_TRANSIENT);
        sqlite3_free(zText);
      }
      break;
    }
    case SQLITE_TEXT: {
      int i,j;
      u64 n;
      const unsigned char *zArg = sqlite3_value_text(argv[0]);
      char *z;

      if( zArg==0 ) return;
      for(i=0, n=0; zArg[i]; i++){ if( zArg[i]=='\'' ) n++; }
      z = contextMalloc(context, ((i64)i)+((i64)n)+3);
      if( z ){
        z[0] = '\'';
        for(i=0, j=1; zArg[i]; i++){
          z[j++] = zArg[i];
          if( zArg[i]=='\'' ){
            z[j++] = '\'';
          }
        }
        z[j++] = '\'';
        z[j] = 0;
        sqlite3_result_text(context, z, j, sqlite3_free);
      }
      break;
    }
    default: {
      assert( sqlite3_value_type(argv[0])==SQLITE_NULL );
      sqlite3_result_text(context, "NULL", 4, SQLITE_STATIC);
      break;
    }
  }
}